

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestChildExtensionData_NestedTestAllExtensionsData::
~TestChildExtensionData_NestedTestAllExtensionsData
          (TestChildExtensionData_NestedTestAllExtensionsData *this)

{
  TestChildExtensionData_NestedTestAllExtensionsData *this_local;
  
  ~TestChildExtensionData_NestedTestAllExtensionsData(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestChildExtensionData_NestedTestAllExtensionsData::~TestChildExtensionData_NestedTestAllExtensionsData() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestChildExtensionData.NestedTestAllExtensionsData)
  SharedDtor(*this);
}